

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

Reference __thiscall
mp::BasicExprFactory<std::allocator<char>_>::MakeReference
          (BasicExprFactory<std::allocator<char>_> *this,Kind kind,int index)

{
  Impl *impl;
  Reference RVar1;
  Impl *local_20;
  
  local_20 = (Impl *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)&this->exprs_,&local_20);
  impl = (Impl *)operator_new__(0x40);
  impl->kind_ = kind;
  (this->exprs_).
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = impl;
  impl[1].kind_ = index;
  RVar1 = internal::ExprBase::Create<mp::Reference>(impl);
  return (Reference)RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_
  ;
}

Assistant:

Reference MakeReference(expr::Kind kind, int index) {
    typename Reference::Impl *impl = Allocate<Reference>(kind);
    impl->index = index;
    return Expr::Create<Reference>(impl);
  }